

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O0

path * wallet::BDBDataFile(path *wallet_path)

{
  bool bVar1;
  path *in_RDI;
  long in_FS_OFFSET;
  path *in_stack_ffffffffffffff88;
  path *in_stack_ffffffffffffff98;
  char *p2;
  path *p1;
  char local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p1 = in_RDI;
  bVar1 = std::filesystem::is_regular_file(in_stack_ffffffffffffff98);
  if (bVar1) {
    fs::path::path(in_stack_ffffffffffffff88,(path *)0xbc3f6c);
  }
  else {
    p2 = local_30;
    fs::path::path(in_stack_ffffffffffffff88,(path *)0xbc3f82);
    fs::operator/(p1,p2);
    fs::path::~path(in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

fs::path BDBDataFile(const fs::path& wallet_path)
{
    if (fs::is_regular_file(wallet_path)) {
        // Special case for backwards compatibility: if wallet path points to an
        // existing file, treat it as the path to a BDB data file in a parent
        // directory that also contains BDB log files.
        return wallet_path;
    } else {
        // Normal case: Interpret wallet path as a directory path containing
        // data and log files.
        return wallet_path / "wallet.dat";
    }
}